

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::extend<8ul,unsigned_char,unsigned_short,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  Type *other;
  long lVar1;
  Literal *this_00;
  undefined1 local_280 [8];
  LaneArray<8UL_*_2> lanes;
  LaneArray<8UL> result;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_280,this,vec);
  lVar1 = 0;
  memset(&lanes._M_elems[0xf].type,0,0xc0);
  other = &result._M_elems[7].type;
  do {
    if (*(long *)((long)&lanes._M_elems[0].field_0 + lVar1 + 8) != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    result._M_elems[7].type.id._0_4_ = (uint)(byte)local_280[lVar1];
    this_00 = (Literal *)((long)result._M_elems + lVar1 + -8);
    if (this_00 != (Literal *)other) {
      Literal::~Literal(this_00);
      Literal::Literal(this_00,(Literal *)other);
    }
    Literal::~Literal((Literal *)other);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xc0);
  Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)&lanes._M_elems[0xf].type);
  lVar1 = 0xa8;
  do {
    Literal::~Literal((Literal *)((long)result._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x168;
  do {
    Literal::~Literal((Literal *)(local_280 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal extend(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lanes[idx].geti32());
  }
  return Literal(result);
}